

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

void __thiscall OpenSSLWrapper::InitOpenSSL::InitOpenSSL(InitOpenSSL *this)

{
  (this->strVersion)._M_dataplus._M_p = (pointer)&(this->strVersion).field_2;
  (this->strVersion)._M_string_length = 0;
  (this->strVersion).field_2._M_local_buf[0] = '\0';
  OpenSSL_version(0);
  std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

InitOpenSSL::InitOpenSSL()
    {
#if OPENSSL_VERSION_NUMBER < 0x10100000L
        SSL_library_init();
        SSL_load_error_strings();
        strVersion = SSLeay_version(SSLEAY_VERSION);
#else
        strVersion = OpenSSL_version(OPENSSL_VERSION);
#endif

#if OPENSSL_VERSION_NUMBER < 0x10100000L
        ERR_load_BIO_strings();
        OpenSSL_add_all_algorithms();

        m_pmutLocks = make_unique<mutex[]>(CRYPTO_num_locks());
        CRYPTO_set_locking_callback(CbLocking);
#endif
    }